

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCFile.cpp
# Opt level: O0

void __thiscall
ASCFile::parse_pin(ASCFile *this,char **p,char **s,char **arena,char **arena_end,
                  line_iterator_t *line_it)

{
  int iVar1;
  char *__s1;
  size_type sVar2;
  reference pvVar3;
  char **in_RSI;
  long in_RDI;
  vector<BRDPart,_std::allocator<BRDPart>_> *this_00;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> *in_R9;
  double posy;
  double posx;
  BRDPin pin;
  char *loc;
  BRDPart part;
  BRDPin *in_stack_fffffffffffffe60;
  anon_class_32_4_fa413470 *this_01;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  BRDPart *in_stack_fffffffffffffe70;
  anon_class_16_2_d7082a65 *in_stack_ffffffffffffffa0;
  
  if ((*(byte *)(in_RDI + 0xc1) & 1) == 0) {
    iVar1 = strncmp(*in_RSI,"Part",4);
    if (iVar1 == 0) {
      *in_RSI = *in_RSI + 4;
      BRDPart::BRDPart(in_stack_fffffffffffffe70);
      parse_pin::anon_class_32_4_fa413470::operator()
                ((anon_class_32_4_fa413470 *)in_stack_fffffffffffffe60);
      __s1 = parse_pin::anon_class_32_4_fa413470::operator()
                       ((anon_class_32_4_fa413470 *)in_stack_fffffffffffffe60);
      strcmp(__s1,"(T)");
      std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                ((vector<BRDPart,_std::allocator<BRDPart>_> *)in_stack_fffffffffffffe70,
                 (value_type *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      BRDPart::~BRDPart((BRDPart *)0x15f9f8);
    }
    else {
      BRDPin::BRDPin(in_stack_fffffffffffffe60);
      this_00 = (vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 0x48);
      std::vector<BRDPart,_std::allocator<BRDPart>_>::size(this_00);
      iVar1 = 10;
      strtol(*in_RSI,in_RSI,10);
      parse_pin::anon_class_32_4_fa413470::operator()
                ((anon_class_32_4_fa413470 *)in_stack_fffffffffffffe60);
      strtod(*in_RSI,in_RSI);
      this_01 = (anon_class_32_4_fa413470 *)0x408f400000000000;
      strtod(*in_RSI,in_RSI);
      strtol(*in_RSI,in_RSI,iVar1);
      parse_pin::anon_class_32_4_fa413470::operator()(this_01);
      parse_pin::anon_class_16_2_d7082a65::operator()(in_stack_ffffffffffffffa0);
      std::vector<BRDPart,_std::allocator<BRDPart>_>::back
                ((vector<BRDPart,_std::allocator<BRDPart>_> *)this_01);
      std::vector<BRDPin,_std::allocator<BRDPin>_>::push_back
                ((vector<BRDPin,_std::allocator<BRDPin>_> *)this_00,
                 (value_type *)CONCAT44(iVar1,in_stack_fffffffffffffe68));
      sVar2 = std::vector<BRDPin,_std::allocator<BRDPin>_>::size
                        ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0x60));
      pvVar3 = std::vector<BRDPart,_std::allocator<BRDPart>_>::back
                         ((vector<BRDPart,_std::allocator<BRDPart>_> *)this_01);
      pvVar3->end_of_pins = (uint)sVar2;
    }
  }
  else {
    __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::operator+=
              (in_R9,7);
    *(undefined1 *)(in_RDI + 0xc1) = 0;
  }
  return;
}

Assistant:

void ASCFile::parse_pin(char *&p, char *&s, char *&arena, char *&arena_end, line_iterator_t &line_it) {
	if (m_firstpin) {
		line_it += 7; // Skip 7+1 unused lines before 1st part
		m_firstpin = false;
		return;
	}
	if (!strncmp(p, "Part", 4)) {
		p += 4; // Skip "Part" string
		BRDPart part;

		part.name      = READ_STR();
		part.part_type = BRDPartType::SMD;
		char *loc      = READ_STR();
		if (!strcmp(loc, "(T)"))
			part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
		else
			part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
		part.end_of_pins       = 0;
		parts.push_back(part);
	} else {
		BRDPin pin;

		pin.part = parts.size();
		/*int id =*/READ_INT(); // uint
		/*char *name =*/READ_STR2();
		double posx = READ_DOUBLE();
		pin.pos.x   = posx * 1000.0f;
		double posy = READ_DOUBLE();
		pin.pos.y   = posy * 1000.0f;
		/*int layer =*/READ_INT(); // uint
		pin.net   = READ_STR();
		pin.probe = READ_UINT();
		switch (parts.back().mounting_side) {
			case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
			case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
			case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
		}
		pins.push_back(pin);
		parts.back().end_of_pins = pins.size();
	}
}